

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall
rtc::LogMessage::LogMessage
          (LogMessage *this,char *file,int line,LoggingSeverity sev,LogErrorContext err_ctx,int err,
          char *module)

{
  ostringstream *poVar1;
  long lVar2;
  undefined1 uVar3;
  ostream oVar4;
  char cVar5;
  uint32_t earlier;
  uint32_t later;
  PlatformThreadId PVar6;
  ostream *poVar7;
  char *pcVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  ostream *poVar12;
  ostringstream tmp;
  undefined1 auStack_1f8 [8];
  int local_1f0;
  int local_1ec;
  string *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  string *local_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  local_1f0 = err;
  local_1ec = line;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->severity_ = sev;
  local_1d0 = &this->tag_;
  local_1d8 = &(this->tag_).field_2;
  (this->tag_)._M_dataplus._M_p = (pointer)local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"libjingle","");
  local_1e8 = (string *)&this->extra_;
  local_1e0 = &(this->extra_).field_2;
  (this->extra_)._M_dataplus._M_p = (pointer)local_1e0;
  (this->extra_)._M_string_length = 0;
  (this->extra_).field_2._M_local_buf[0] = '\0';
  if (timestamp_ == '\x01') {
    earlier = LogStartTime();
    later = Time32();
    TimeDiff(later,earlier);
    WallClockStartTime();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
    poVar1 = &this->print_stream_ + *(long *)(*(long *)this + -0x18);
    if ((&this->field_0xe1)[*(long *)(*(long *)this + -0x18)] == '\0') {
      uVar3 = std::ios::widen((char)poVar1);
      poVar1[0xe0] = (ostringstream)uVar3;
      poVar1[0xe1] = (ostringstream)0x1;
    }
    poVar1[0xe0] = (ostringstream)0x30;
    *(undefined8 *)(&this->field_0x10 + *(long *)(*(long *)this + -0x18)) = 3;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,":",1);
    *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 3;
    poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
    poVar12 = poVar7 + *(long *)(*(long *)poVar7 + -0x18);
    if (poVar7[*(long *)(*(long *)poVar7 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar12);
      poVar12[0xe0] = oVar4;
      poVar12[0xe1] = (ostream)0x1;
    }
    poVar12[0xe0] = (ostream)0x20;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
  }
  if (thread_ == '\x01') {
    PVar6 = CurrentThreadId();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"[",1);
    *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) =
         *(uint *)(&this->field_0x18 + *(long *)(*(long *)this + -0x18)) & 0xffffffb5 | 2;
    poVar7 = (ostream *)std::ostream::operator<<(this,PVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] ",2);
  }
  if (file != (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"(",1);
    pcVar8 = strrchr(file,0x2f);
    pcVar9 = strrchr(file,0x5c);
    pcVar11 = pcVar9;
    if (pcVar9 < pcVar8) {
      pcVar11 = pcVar8;
    }
    pcVar11 = pcVar11 + 1;
    if (pcVar8 == (char *)0x0 && pcVar9 == (char *)0x0) {
      pcVar11 = file;
    }
    sVar10 = strlen(pcVar11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,pcVar11,sVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,":",1);
    poVar7 = (ostream *)std::ostream::operator<<(this,local_1ec);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"): ",3);
  }
  if (err_ctx != ERRCTX_NONE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[0x",3);
    lVar2 = *(long *)(local_1a8[0] + -0x18);
    if (acStack_c8[lVar2 + 1] == '\0') {
      cVar5 = std::ios::widen((char)auStack_1f8 + (char)lVar2 + 'P');
      acStack_c8[lVar2] = cVar5;
      acStack_c8[lVar2 + 1] = '\x01';
    }
    acStack_c8[lVar2] = '0';
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 8;
    poVar7 = (ostream *)std::ostream::operator<<(local_1a8,local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"]",1);
    if (err_ctx == ERRCTX_EN) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      pcVar11 = strerror(local_1f0);
      if (pcVar11 == (char *)0x0) {
        std::ios::clear((int)auStack_1f8 + (int)*(undefined8 *)(local_1a8[0] + -0x18) + 0x50);
      }
      else {
        sVar10 = strlen(pcVar11);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar11,sVar10);
      }
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=(local_1e8,(string *)local_1c8);
    if (local_1c8[0] != local_1b8) {
      operator_delete(local_1c8[0]);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

LogMessage::LogMessage(const char* file,
                       int line,
                       LoggingSeverity sev,
                       LogErrorContext err_ctx,
                       int err,
                       const char* module)
    : severity_(sev), tag_(kLibjingle) {
  if (timestamp_) {
    uint32_t time = TimeSince(LogStartTime());
    // Also ensure WallClockStartTime is initialized, so that it matches
    // LogStartTime.
    WallClockStartTime();
    print_stream_ << "[" << std::setfill('0') << std::setw(3) << (time / 1000)
                  << ":" << std::setw(3) << (time % 1000) << std::setfill(' ')
                  << "] ";
  }

  if (thread_) {
    PlatformThreadId id = CurrentThreadId();
    print_stream_ << "[" << std::dec << id << "] ";
  }

  if (file != NULL)
    print_stream_ << "(" << FilenameFromPath(file)  << ":" << line << "): ";

  if (err_ctx != ERRCTX_NONE) {
    std::ostringstream tmp;
    tmp << "[0x" << std::setfill('0') << std::hex << std::setw(8) << err << "]";
    switch (err_ctx) {
      case ERRCTX_ERRNO:
        tmp << " " << strerror(err);
        break;
#if WEBRTC_WIN
      case ERRCTX_HRESULT: {
        char msgbuf[256];
        DWORD flags = FORMAT_MESSAGE_FROM_SYSTEM;
        HMODULE hmod = GetModuleHandleA(module);
        if (hmod)
          flags |= FORMAT_MESSAGE_FROM_HMODULE;
        if (DWORD len = FormatMessageA(
            flags, hmod, err,
            MAKELANGID(LANG_NEUTRAL, SUBLANG_DEFAULT),
            msgbuf, sizeof(msgbuf) / sizeof(msgbuf[0]), NULL)) {
          while ((len > 0) &&
              isspace(static_cast<unsigned char>(msgbuf[len-1]))) {
            msgbuf[--len] = 0;
          }
          tmp << " " << msgbuf;
        }
        break;
      }
#endif  // WEBRTC_WIN
#if defined(WEBRTC_MAC) && !defined(WEBRTC_IOS)
      case ERRCTX_OSSTATUS: {
        tmp << " " << nonnull(GetMacOSStatusErrorString(err), "Unknown error");
        if (const char* desc = GetMacOSStatusCommentString(err)) {
          tmp << ": " << desc;
        }
        break;
      }
#endif  // WEBRTC_MAC && !defined(WEBRTC_IOS)
      default:
        break;
    }
    extra_ = tmp.str();
  }
}